

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg_Data.h
# Opt level: O1

void __thiscall
Nova::Arg_Data::Initialize
          (Arg_Data *this,string *input_str,string *input_val_name,string *input_desc,
          string *default_val_name)

{
  std::__cxx11::string::_M_assign((string *)&this->str);
  this->value_set = false;
  if ((input_val_name->_M_string_length != 0) || (default_val_name->_M_string_length != 0)) {
    std::__cxx11::string::_M_assign((string *)&this->val_name);
  }
  if ((input_desc->_M_string_length == 0) && (input_val_name->_M_string_length == 0)) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->desc,0,(char *)(this->desc)._M_string_length,0x1320da);
    return;
  }
  std::__cxx11::string::_M_assign((string *)&this->desc);
  return;
}

Assistant:

void Initialize(const std::string& input_str,const std::string& input_val_name,const std::string& input_desc,const std::string& default_val_name="")
    {
        str=input_str;value_set=false;
        if(input_val_name.length()) val_name=input_val_name;
        else if(default_val_name.length()) val_name=default_val_name;
        if(!input_desc.length())
        {
            if(input_val_name.length()) desc=input_val_name;
            else desc="<no description available>";
        }
        else desc=input_desc;
    }